

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::ParseNode_Texture(AMFImporter *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement_Texture *this_00;
  DeadlyImportError *pDVar7;
  string *psVar8;
  int pAttrIdx;
  ulong uVar9;
  allocator<char> local_c9;
  string an;
  uint local_a4;
  CAMFImporter_NodeElement *ne;
  ulong local_98;
  string enc64_data;
  string id;
  string type;
  
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  uVar9 = 0;
  id.field_2._M_local_buf[0] = '\0';
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  enc64_data._M_dataplus._M_p = (pointer)&enc64_data.field_2;
  enc64_data._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  enc64_data.field_2._M_local_buf[0] = '\0';
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  local_a4 = 1;
  bVar2 = false;
  local_98 = 0;
  uVar5 = 0;
  do {
    pAttrIdx = (int)uVar9;
    if (iVar3 == pAttrIdx) {
      this_00 = (CAMFImporter_NodeElement_Texture *)operator_new(0x88);
      CAMFImporter_NodeElement_Texture::CAMFImporter_NodeElement_Texture
                (this_00,this->mNodeElement_Cur);
      ne = (CAMFImporter_NodeElement *)this_00;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
      uVar9 = local_98;
      if ((char)iVar3 == '\0') {
        XML_ReadNode_GetVal_AsString(this,&enc64_data);
      }
      if (id._M_string_length == 0) {
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&an,"ID for texture must be defined.",&local_c9);
        DeadlyImportError::DeadlyImportError(pDVar7,&an);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar5 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&an,"width",&local_c9);
        Throw_IncorrectAttrValue(this,&an);
        std::__cxx11::string::~string((string *)&an);
      }
      iVar3 = (int)uVar9;
      if (iVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&an,"height",&local_c9);
        Throw_IncorrectAttrValue(this,&an);
        std::__cxx11::string::~string((string *)&an);
      }
      if (local_a4 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&an,"depth",&local_c9);
        Throw_IncorrectAttrValue(this,&an);
        std::__cxx11::string::~string((string *)&an);
      }
      bVar1 = std::operator!=(&type,"grayscale");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&an,"type",&local_c9);
        Throw_IncorrectAttrValue(this,&an);
        std::__cxx11::string::~string((string *)&an);
      }
      if (enc64_data._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)&(this_00->super_CAMFImporter_NodeElement).ID);
        this_00->Width = (ulong)uVar5;
        this_00->Height = uVar9 & 0xffffffff;
        this_00->Depth = (ulong)local_a4;
        this_00->Tiled = bVar2;
        ParseHelper_Decode_Base64(this,&enc64_data,&this_00->Data);
        if ((long)(this_00->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == (ulong)(iVar3 * local_a4 * uVar5)) {
          std::__cxx11::
          list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::push_back
                    (&this->mNodeElement_Cur->Child,&ne);
          std::__cxx11::
          list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::push_back
                    (&this->mNodeElement_List,&ne);
          std::__cxx11::string::~string((string *)&enc64_data);
          std::__cxx11::string::~string((string *)&type);
          std::__cxx11::string::~string((string *)&id);
          return;
        }
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&an,"Texture has incorrect data size.",&local_c9);
        DeadlyImportError::DeadlyImportError(pDVar7,&an);
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&an,"Texture data not defined.",&local_c9);
      DeadlyImportError::DeadlyImportError(pDVar7,&an);
      __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar4),(allocator<char> *)&ne);
    bVar1 = std::operator==(&an,"id");
    if (bVar1) {
      (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,uVar9);
      psVar8 = &id;
LAB_003c82b5:
      std::__cxx11::string::assign((char *)psVar8);
    }
    else {
      bVar1 = std::operator==(&an,"width");
      if (bVar1) {
        uVar5 = XML_ReadNode_GetAttrVal_AsU32(this,pAttrIdx);
      }
      else {
        bVar1 = std::operator==(&an,"height");
        if (bVar1) {
          uVar6 = XML_ReadNode_GetAttrVal_AsU32(this,pAttrIdx);
          local_98 = CONCAT44(extraout_var_00,uVar6);
        }
        else {
          bVar1 = std::operator==(&an,"depth");
          if (bVar1) {
            local_a4 = XML_ReadNode_GetAttrVal_AsU32(this,pAttrIdx);
          }
          else {
            bVar1 = std::operator==(&an,"type");
            if (bVar1) {
              (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,uVar9);
              psVar8 = &type;
              goto LAB_003c82b5;
            }
            bVar1 = std::operator==(&an,"tiled");
            if (bVar1) {
              bVar2 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              Throw_IncorrectAttr(this,&an);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
    uVar9 = (ulong)(pAttrIdx + 1);
  } while( true );
}

Assistant:

void AMFImporter::ParseNode_Texture()
{
    std::string id;
    uint32_t width = 0;
    uint32_t height = 0;
    uint32_t depth = 1;
    std::string type;
    bool tiled = false;
    std::string enc64_data;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("width", width, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("depth", depth, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("tiled", tiled, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// create new texture object.
    CAMFImporter_NodeElement *ne = new CAMFImporter_NodeElement_Texture(mNodeElement_Cur);

	CAMFImporter_NodeElement_Texture& als = *((CAMFImporter_NodeElement_Texture*)ne);// alias for convenience

	// Check for child nodes
    if (!mReader->isEmptyElement()) {
        XML_ReadNode_GetVal_AsString(enc64_data);
    }

	// check that all components was defined
    if (id.empty()) {
        throw DeadlyImportError("ID for texture must be defined.");
    }
    if (width < 1) {
        Throw_IncorrectAttrValue("width");
    }
    if (height < 1) {
        Throw_IncorrectAttrValue("height");
    }
    if (depth < 1) {
        Throw_IncorrectAttrValue("depth");
    }
    if (type != "grayscale") {
        Throw_IncorrectAttrValue("type");
    }
    if (enc64_data.empty()) {
        throw DeadlyImportError("Texture data not defined.");
    }
	// copy data
	als.ID = id;
	als.Width = width;
	als.Height = height;
	als.Depth = depth;
	als.Tiled = tiled;
	ParseHelper_Decode_Base64(enc64_data, als.Data);

    // check data size
    if ((width * height * depth) != als.Data.size()) {
        throw DeadlyImportError("Texture has incorrect data size.");
    }

	mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}